

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O0

void ogt_mesh_smooth_normals(ogt_voxel_meshify_context *ctx,ogt_mesh *mesh)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ogt_mesh_vertex *poVar4;
  ogt_mesh_vertex *poVar5;
  void *__s;
  uint32_t *table;
  uint32_t *puVar6;
  void *__s_00;
  undefined8 *puVar7;
  float fVar8;
  ogt_mesh_vec3 oVar9;
  undefined1 local_190 [8];
  ogt_mesh_vec3 accumulated_normal;
  uint32_t vertex_index_1;
  uint32_t ri2;
  uint32_t ri1;
  uint32_t ri0;
  ogt_mesh_vec3 local_f8;
  ogt_mesh_vec3 local_e8;
  ogt_mesh_vec3 local_d8;
  undefined1 local_c8 [8];
  ogt_mesh_vec3 normal;
  ogt_mesh_vertex v2;
  ogt_mesh_vertex v1;
  ogt_mesh_vertex v0;
  uint32_t i2;
  uint32_t i1;
  uint32_t i0;
  uint32_t i;
  ogt_mesh_vec3 *remap_normals;
  uint32_t *hash_table_entry;
  uint32_t vertex_index;
  uint32_t num_unique_vertices;
  uint32_t *hash_table;
  uint32_t hash_table_mask;
  uint32_t hash_table_size;
  uint32_t *remap_indices;
  ogt_mesh *mesh_local;
  ogt_voxel_meshify_context *ctx_local;
  
  __s = _voxel_meshify_malloc(ctx,(ulong)mesh->vertex_count << 2);
  memset(__s,0xff,(ulong)mesh->vertex_count << 2);
  for (hash_table._4_4_ = 1; hash_table._4_4_ < mesh->vertex_count;
      hash_table._4_4_ = hash_table._4_4_ << 1) {
  }
  table = (uint32_t *)_voxel_meshify_malloc(ctx,(ulong)hash_table._4_4_ << 2);
  memset(table,0xff,(ulong)hash_table._4_4_ << 2);
  hash_table_entry._4_4_ = 0;
  hash_table_entry._0_4_ = 0;
  do {
    if (mesh->vertex_count <= (uint)hash_table_entry) {
      _voxel_meshify_free(ctx,table);
      __s_00 = _voxel_meshify_malloc(ctx,(ulong)mesh->vertex_count * 0xc);
      memset(__s_00,0,(ulong)mesh->vertex_count * 0xc);
      for (i1 = 0; i1 < mesh->index_count; i1 = i1 + 3) {
        uVar1 = mesh->indices[i1];
        uVar2 = mesh->indices[i1 + 1];
        uVar3 = mesh->indices[i1 + 2];
        v1.color = (ogt_mesh_rgba)mesh->vertices[uVar1].pos.x;
        v1.palette_index = (uint32_t)mesh->vertices[uVar1].pos.y;
        poVar4 = mesh->vertices + uVar2;
        v2.color = (ogt_mesh_rgba)(poVar4->pos).x;
        v2.palette_index = (uint32_t)(poVar4->pos).y;
        v1.pos._0_8_ = *(undefined8 *)&(poVar4->pos).z;
        poVar4 = mesh->vertices + uVar2;
        v1.pos.z = (poVar4->normal).y;
        v1.normal.x = (poVar4->normal).z;
        v1.normal._4_8_ = *(undefined8 *)(&(poVar4->normal).y + 2);
        poVar4 = mesh->vertices + uVar3;
        normal.z = (poVar4->pos).x;
        unique0x1000035c = (poVar4->pos).y;
        v2.pos._0_8_ = *(undefined8 *)&(poVar4->pos).z;
        poVar4 = mesh->vertices + uVar3;
        v2.pos.z = (poVar4->normal).y;
        v2.normal.x = (poVar4->normal).z;
        v2.normal._4_8_ = *(undefined8 *)(&(poVar4->normal).y + 2);
        oVar9 = _sub3((ogt_mesh_vec3 *)&v2.color,(ogt_mesh_vec3 *)&v1.color);
        local_e8.z = oVar9.z;
        local_e8._0_8_ = oVar9._0_8_;
        local_d8._0_8_ = local_e8._0_8_;
        local_d8.z = local_e8.z;
        oVar9 = _sub3((ogt_mesh_vec3 *)&normal.z,(ogt_mesh_vec3 *)&v1.color);
        local_f8.z = oVar9.z;
        local_f8._0_8_ = oVar9._0_8_;
        oVar9 = _cross3(&local_d8,&local_f8);
        normal.x = oVar9.z;
        local_c8 = oVar9._0_8_;
        uVar1 = *(uint *)((long)__s + (ulong)uVar1 * 4);
        uVar2 = *(uint *)((long)__s + (ulong)uVar2 * 4);
        uVar3 = *(uint *)((long)__s + (ulong)uVar3 * 4);
        oVar9 = _add3((ogt_mesh_vec3 *)((long)__s_00 + (ulong)uVar1 * 0xc),(ogt_mesh_vec3 *)local_c8
                     );
        *(float *)((long)__s_00 + (ulong)uVar1 * 0xc + 8) = oVar9.z;
        *(long *)((long)__s_00 + (ulong)uVar1 * 0xc) = oVar9._0_8_;
        oVar9 = _add3((ogt_mesh_vec3 *)((long)__s_00 + (ulong)uVar2 * 0xc),(ogt_mesh_vec3 *)local_c8
                     );
        *(float *)((long)__s_00 + (ulong)uVar2 * 0xc + 8) = oVar9.z;
        *(long *)((long)__s_00 + (ulong)uVar2 * 0xc) = oVar9._0_8_;
        oVar9 = _add3((ogt_mesh_vec3 *)((long)__s_00 + (ulong)uVar3 * 0xc),(ogt_mesh_vec3 *)local_c8
                     );
        unique0x100000d3 = oVar9._0_8_;
        puVar7 = (undefined8 *)((long)__s_00 + (ulong)uVar3 * 0xc);
        *puVar7 = unique0x100000d3;
        *(float *)(puVar7 + 1) = oVar9.z;
      }
      for (accumulated_normal.y = 0.0; (uint)accumulated_normal.y < mesh->vertex_count;
          accumulated_normal.y = (float)((int)accumulated_normal.y + 1)) {
        puVar7 = (undefined8 *)
                 ((long)__s_00 +
                 (ulong)*(uint *)((long)__s + (ulong)(uint)accumulated_normal.y * 4) * 0xc);
        local_190 = (undefined1  [8])*puVar7;
        accumulated_normal.x = *(float *)(puVar7 + 1);
        fVar8 = _dot3((ogt_mesh_vec3 *)local_190,(ogt_mesh_vec3 *)local_190);
        if (0.001 < fVar8) {
          oVar9 = _normalize3((ogt_mesh_vec3 *)local_190);
          poVar4 = mesh->vertices;
          poVar5 = poVar4 + (uint)accumulated_normal.y;
          (poVar5->normal).x = (float)(int)oVar9._0_8_;
          (poVar5->normal).y = (float)(int)((ulong)oVar9._0_8_ >> 0x20);
          poVar4[(uint)accumulated_normal.y].normal.z = oVar9.z;
        }
      }
      _voxel_meshify_free(ctx,__s_00);
      _voxel_meshify_free(ctx,__s);
      return;
    }
    puVar6 = hash_table_find_vertex_position
                       (table,hash_table._4_4_ - 1,mesh->vertices,(uint)hash_table_entry);
    if (*puVar6 == 0xffffffff) {
      *puVar6 = (uint)hash_table_entry;
      *(int *)((long)__s + (ulong)(uint)hash_table_entry * 4) = hash_table_entry._4_4_;
      hash_table_entry._4_4_ = hash_table_entry._4_4_ + 1;
    }
    else {
      if (*(int *)((long)__s + (ulong)*puVar6 * 4) == -1) {
        __assert_fail("remap_indices[*hash_table_entry] != UINT32_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                      ,499,
                      "void ogt_mesh_smooth_normals(const ogt_voxel_meshify_context *, ogt_mesh *)")
        ;
      }
      *(undefined4 *)((long)__s + (ulong)(uint)hash_table_entry * 4) =
           *(undefined4 *)((long)__s + (ulong)*puVar6 * 4);
    }
    hash_table_entry._0_4_ = (uint)hash_table_entry + 1;
  } while( true );
}

Assistant:

void ogt_mesh_smooth_normals(const ogt_voxel_meshify_context* ctx, ogt_mesh* mesh) {
    // generate an remap table for vertex indices based on the vertex positions.
    uint32_t* remap_indices = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * mesh->vertex_count);
    memset(remap_indices, -1, mesh->vertex_count * sizeof(uint32_t));
    {
        // allocate a hash table that is sized at the next power of 2 above the vertex count
        uint32_t hash_table_size = 1;
        while (hash_table_size < mesh->vertex_count)
            hash_table_size *= 2;
        uint32_t hash_table_mask = hash_table_size - 1;
        uint32_t* hash_table = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * hash_table_size);
        memset(hash_table, -1, hash_table_size * sizeof(uint32_t));

        // create a unique mapping for each vertex based purely on its position
        uint32_t num_unique_vertices = 0;
        for (uint32_t vertex_index = 0; vertex_index < mesh->vertex_count; vertex_index++) {
            uint32_t* hash_table_entry = hash_table_find_vertex_position(hash_table, hash_table_mask, mesh->vertices, vertex_index);
            if (*hash_table_entry == UINT32_MAX) {
                // vertex is not already in the hash table. allocate a unique index for it.
                *hash_table_entry = vertex_index;
                remap_indices[vertex_index] = num_unique_vertices++;
            }
            else {
                // vertex is already in the hash table. Point this to the index that is already existing!
                assert(remap_indices[*hash_table_entry] != UINT32_MAX);
                remap_indices[vertex_index] = remap_indices[*hash_table_entry];
            }
        }
        // now that we have remap_indices, we no longer need the hash table. 
        _voxel_meshify_free(ctx, hash_table);
    }

    // for each triangle face, add the normal of the face to the unique normal for the vertex
    ogt_mesh_vec3* remap_normals = (ogt_mesh_vec3*)_voxel_meshify_malloc(ctx, sizeof(ogt_mesh_vec3) * mesh->vertex_count);
    memset(remap_normals, 0, sizeof(ogt_mesh_vec3) * mesh->vertex_count);

    for (uint32_t i = 0; i < mesh->index_count; i += 3) {
        uint32_t i0 = mesh->indices[i + 0];
        uint32_t i1 = mesh->indices[i + 1];
        uint32_t i2 = mesh->indices[i + 2];
        ogt_mesh_vertex v0 = mesh->vertices[i0];
        ogt_mesh_vertex v1 = mesh->vertices[i1];
        ogt_mesh_vertex v2 = mesh->vertices[i2];
        ogt_mesh_vec3 normal = _cross3(_sub3(v1.pos, v0.pos), _sub3(v2.pos, v0.pos));

        uint32_t ri0 = remap_indices[i0];
        uint32_t ri1 = remap_indices[i1];
        uint32_t ri2 = remap_indices[i2];
        remap_normals[ri0] = _add3(remap_normals[ri0], normal);
        remap_normals[ri1] = _add3(remap_normals[ri1], normal);
        remap_normals[ri2] = _add3(remap_normals[ri2], normal);
    }

    // for each vertex, copy over remap normal if it's non-zero.
    for (uint32_t vertex_index = 0; vertex_index < mesh->vertex_count; vertex_index++) {
        ogt_mesh_vec3 accumulated_normal = remap_normals[remap_indices[vertex_index]];
        if (_dot3(accumulated_normal, accumulated_normal) > 0.001f)
            mesh->vertices[vertex_index].normal = _normalize3(accumulated_normal);
    }

    _voxel_meshify_free(ctx, remap_normals);
    _voxel_meshify_free(ctx, remap_indices);
}